

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

APInt * __thiscall llvm::APInt::operator=(APInt *this,APInt *RHS)

{
  uint uVar1;
  uint64_t *puVar2;
  APInt *pAVar3;
  
  if ((this->BitWidth < 0x41) && (RHS->BitWidth < 0x41)) {
    puVar2 = (RHS->U).pVal;
    (this->U).pVal = puVar2;
    uVar1 = RHS->BitWidth;
    this->BitWidth = uVar1;
    pAVar3 = this;
    if (0x40 < (ulong)uVar1) {
      pAVar3 = (APInt *)(puVar2 + ((int)((ulong)uVar1 + 0x3f >> 6) - 1));
      puVar2 = (uint64_t *)(pAVar3->U).VAL;
    }
    (pAVar3->U).VAL = (ulong)((long)puVar2 << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
  }
  else {
    AssignSlowCase(this,RHS);
  }
  return this;
}

Assistant:

APInt &operator=(const APInt &RHS) {
    // If the bitwidths are the same, we can avoid mucking with memory
    if (isSingleWord() && RHS.isSingleWord()) {
      U.VAL = RHS.U.VAL;
      BitWidth = RHS.BitWidth;
      return clearUnusedBits();
    }

    AssignSlowCase(RHS);
    return *this;
  }